

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inc_densities.c
# Opt level: O3

int inc_densities(float32 ***new_mixw,vector_t ***new_mean,vector_t ***new_var,
                 vector_t ****new_fullvar,float32 ***mixw,vector_t ***mean,vector_t ***var,
                 vector_t ****fullvar,float32 ***dnom,uint32 n_mixw,uint32 n_mgau,uint32 n_dnom,
                 uint32 n_feat,uint32 n_density,uint32 *veclen,uint32 n_inc)

{
  vector_t ***ppppfVar1;
  float *pfVar2;
  float fVar3;
  uint *puVar4;
  float32 *pfVar5;
  vector_t *ppfVar6;
  ulong d1;
  void *pvVar7;
  vector_t ***ppppfVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  void *__src;
  vector_t pfVar16;
  vector_t pfVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  float fVar21;
  double dVar22;
  
  if (n_mgau >= n_mixw && n_mgau != n_mixw) {
    __assert_fail("n_mgau <= n_mixw",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/inc_densities.c"
                  ,0x60,
                  "int inc_densities(float32 ***, vector_t ***, vector_t ***, vector_t ****, float32 ***, vector_t ***, vector_t ***, vector_t ****, float32 ***, uint32, uint32, uint32, uint32, uint32, const uint32 *, uint32)"
                 );
  }
  if (n_mgau < n_mixw) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/inc_densities.c"
            ,99,"Splitting of the tied mixture gaussians is not yet implemented\n");
    exit(1);
  }
  if (n_mgau == 0) {
    __ckd_calloc_2d__((ulong)n_feat,(ulong)n_inc,4,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/inc_densities.c"
                      ,0x80);
  }
  else {
    d1 = (ulong)n_feat;
    uVar18 = 0;
    do {
      if (n_feat != 0) {
        uVar15 = 0;
        do {
          if (n_density != 0) {
            lVar14 = 0;
            do {
              memcpy(*(void **)((long)new_mean[uVar18][uVar15] + lVar14 * 2),
                     *(void **)((long)mean[uVar18][uVar15] + lVar14 * 2),(ulong)veclen[uVar15] << 2)
              ;
              if (fullvar == (vector_t ****)0x0) {
                pvVar7 = *(void **)((long)new_var[uVar18][uVar15] + lVar14 * 2);
                __src = *(void **)((long)var[uVar18][uVar15] + lVar14 * 2);
                uVar10 = veclen[uVar15];
              }
              else {
                pvVar7 = (void *)**(undefined8 **)((long)new_fullvar[uVar18][uVar15] + lVar14 * 2);
                __src = (void *)**(undefined8 **)((long)fullvar[uVar18][uVar15] + lVar14 * 2);
                uVar10 = veclen[uVar15] * veclen[uVar15];
              }
              memcpy(pvVar7,__src,(ulong)uVar10 << 2);
              *(undefined4 *)((long)new_mixw[uVar18][uVar15] + lVar14) =
                   *(undefined4 *)((long)mixw[uVar18][uVar15] + lVar14);
              lVar14 = lVar14 + 4;
            } while ((ulong)n_density * 4 - lVar14 != 0);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != d1);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != n_mgau);
    pvVar7 = __ckd_calloc_2d__(d1,(ulong)n_inc,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/inc_densities.c"
                               ,0x80);
    if (n_mgau != 0) {
      uVar18 = 0;
      do {
        printf("%u:",uVar18 & 0xffffffff);
        fflush(_stdout);
        if (n_inc != 0) {
          ppppfVar1 = var + uVar18;
          uVar15 = 0;
          do {
            if (n_feat != 0) {
              uVar10 = (int)uVar15 + n_density;
              uVar20 = 0;
              do {
                uVar19 = (ulong)n_density;
                puVar4 = *(uint **)((long)pvVar7 + uVar20 * 8);
                puVar4[uVar15] = n_density;
                if (n_density == 0) {
                  uVar19 = 0;
                  dVar22 = -1.0;
                }
                else {
                  uVar12 = 0;
                  fVar21 = -1.0;
                  do {
                    fVar3 = (float)dnom[uVar18][uVar20][uVar12];
                    if (fVar21 < fVar3) {
                      if (uVar15 == 0) {
LAB_00102e69:
                        uVar19 = uVar12 & 0xffffffff;
                        fVar21 = fVar3;
                      }
                      else if (uVar12 != *puVar4) {
                        uVar9 = 1;
                        do {
                          uVar13 = uVar9;
                          if (uVar15 == uVar13) break;
                          uVar9 = uVar13 + 1;
                        } while (uVar12 != puVar4[uVar13]);
                        if (uVar15 <= uVar13) goto LAB_00102e69;
                      }
                    }
                    uVar12 = uVar12 + 1;
                  } while (uVar12 != n_density);
                  dVar22 = (double)fVar21;
                }
                pfVar2 = (float *)(dnom[uVar18][uVar20] + uVar19);
                if (1.2e-38 < *pfVar2 || *pfVar2 == 1.2e-38) {
                  pfVar5 = new_mixw[uVar18][uVar20];
                  fVar21 = (float)pfVar5[uVar19];
                  pfVar5[uVar19] = (float32)(fVar21 * 0.5);
                  pfVar5[uVar10] = (float32)(fVar21 * 0.5);
                  if (fullvar == (vector_t ****)0x0) {
                    pfVar17 = new_var[uVar18][uVar20][uVar10];
                    pfVar16 = (*ppppfVar1)[uVar20][uVar19];
                    uVar11 = veclen[uVar20];
                  }
                  else {
                    pfVar17 = *new_fullvar[uVar18][uVar20][uVar10];
                    pfVar16 = *fullvar[uVar18][uVar20][uVar19];
                    uVar11 = veclen[uVar20] * veclen[uVar20];
                  }
                  memcpy(pfVar17,pfVar16,(ulong)uVar11 << 2);
                  if (veclen[uVar20] != 0) {
                    uVar12 = 0;
                    do {
                      ppppfVar8 = ppppfVar1;
                      uVar9 = uVar20;
                      uVar13 = uVar19;
                      if (fullvar != (vector_t ****)0x0) {
                        ppppfVar8 = fullvar[uVar18] + uVar20;
                        uVar9 = uVar19;
                        uVar13 = uVar12;
                      }
                      fVar21 = (*ppppfVar8)[uVar9][uVar13][uVar12];
                      if (fVar21 < 0.0) {
                        fVar21 = sqrtf(fVar21);
                      }
                      else {
                        fVar21 = SQRT(fVar21);
                      }
                      pfVar17 = mean[uVar18][uVar20][uVar19];
                      ppfVar6 = new_mean[uVar18][uVar20];
                      ppfVar6[uVar19][uVar12] = fVar21 * 0.2 + pfVar17[uVar12];
                      ppfVar6[uVar10][uVar12] = fVar21 * -0.2 + pfVar17[uVar12];
                      uVar12 = uVar12 + 1;
                    } while (uVar12 < veclen[uVar20]);
                  }
                  *(int *)(*(long *)((long)pvVar7 + uVar20 * 8) + uVar15 * 4) = (int)uVar19;
                  printf("%u(%.2e)",dVar22,uVar19);
                  fflush(_stdout);
                }
                else {
                  err_msg(ERR_WARN,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/inc_densities.c"
                          ,0x94,"(mgau= %u, feat= %u, density= %u) never observed skipping\n",
                          uVar18 & 0xffffffff,uVar20 & 0xffffffff,n_density);
                  new_mixw[uVar18][uVar20][uVar10] = 0.0;
                  if (fullvar == (vector_t ****)0x0) {
                    pfVar17 = new_var[uVar18][uVar20][uVar10];
                    pfVar16 = *(*ppppfVar1)[uVar20];
                    uVar11 = veclen[uVar20];
                  }
                  else {
                    pfVar17 = *new_fullvar[uVar18][uVar20][uVar10];
                    pfVar16 = **fullvar[uVar18][uVar20];
                    uVar11 = veclen[uVar20] * veclen[uVar20];
                  }
                  memcpy(pfVar17,pfVar16,(ulong)uVar11 << 2);
                  memcpy(new_mean[uVar18][uVar20][uVar10],*mean[uVar18][uVar20],
                         (ulong)veclen[uVar20] << 2);
                }
                uVar20 = uVar20 + 1;
              } while (uVar20 != d1);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != n_inc);
        }
        putchar(10);
        uVar18 = uVar18 + 1;
      } while (uVar18 != n_mgau);
    }
  }
  return 0;
}

Assistant:

int
inc_densities(float32 ***new_mixw,
	      vector_t ***new_mean,
	      vector_t ***new_var,
	      vector_t ****new_fullvar,

	      float32 ***mixw,
	      vector_t ***mean,
	      vector_t ***var,
	      vector_t ****fullvar,
	      float32 ***dnom,
	      
	      uint32 n_mixw,
	      uint32 n_mgau,
	      uint32 n_dnom,
	      uint32 n_feat,
	      uint32 n_density,
	      const uint32 *veclen,
	      uint32 n_inc)
{
    uint32 i, j, k, l, r;
    uint32 **did;
    float32 max_wt;
    uint32 max_wt_idx;
    float32 std;

    assert(n_mgau <= n_mixw);
    
    if (n_mgau < n_mixw) {
	E_FATAL("Splitting of the tied mixture gaussians is not yet implemented\n");
    }

    /* copy old parameters into new arrays */
    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		memcpy(new_mean[i][j][k], mean[i][j][k], veclen[j]*sizeof(float32));
		if (fullvar)
		    memcpy(new_fullvar[i][j][k][0], fullvar[i][j][k][0],
			   veclen[j]*veclen[j]*sizeof(float32));
		else
		    memcpy(new_var[i][j][k], var[i][j][k], veclen[j]*sizeof(float32));
		new_mixw[i][j][k] = mixw[i][j][k];
	    }
	}
    }

    /* Over all mixtures:
     * 	- Find the largest unsplit component density.
     *		- Split it into two components where the new component
     *			mixw_a = mixw_b = 1/2 mixw
     *			mean_a = mean + 0.2 std
     *			mean_b = mean - 0.2 std
     *			var_a = var_b = var
     *
     * New parameters are placed beginning at index n_density
     */

    did = (uint32 **)ckd_calloc_2d(n_feat, n_inc, sizeof(uint32));

    for (i = 0; i < n_mgau; i++) {
	printf("%u:", i);
	fflush(stdout);
	
	for (r = 0; r < n_inc; r++) {
	    for (j = 0; j < n_feat; j++) {
		did[j][r] = n_density;

		/* find the density w/ the largest EM count not yet split (i.e. most probable, most occurances) */
		for (k = 0, max_wt = -1.0, max_wt_idx = n_density; k < n_density; k++) {
		    if ((max_wt < dnom[i][j][k]) && not_done(k, did[j], r)) {
			max_wt = dnom[i][j][k];
			max_wt_idx = k;
		    }
		}

		if ( dnom[i][j][max_wt_idx] < MIN_IEEE_NORM_POS_FLOAT32 ) {
		    E_WARN("(mgau= %u, feat= %u, density= %u) never observed skipping\n",
			   i, j, k);

		    new_mixw[i][j][n_density+r] = 0;

		    if (fullvar)
			memcpy(new_fullvar[i][j][n_density+r][0], fullvar[i][j][0][0],
			       veclen[j]*veclen[j]*sizeof(float32));
		    else 
			memcpy(new_var[i][j][n_density+r], var[i][j][0],
			       veclen[j]*sizeof(float32));

		    memcpy(new_mean[i][j][n_density+r], mean[i][j][0],
			   veclen[j]*sizeof(float32));

		    continue;
		}

		/* mixing weight of prior and new densities == 1/2 prior mixing weight */
		new_mixw[i][j][max_wt_idx] /= 2;
		new_mixw[i][j][n_density+r] = new_mixw[i][j][max_wt_idx];

		/* Keep variance of new class same as old */
		if (fullvar)
		    memcpy(new_fullvar[i][j][n_density+r][0], fullvar[i][j][max_wt_idx][0],
			   veclen[j]*veclen[j]*sizeof(float32));
		else
		    memcpy(new_var[i][j][n_density+r], var[i][j][max_wt_idx],
			   veclen[j]*sizeof(float32));

		/* mean_a = mean + 0.2 std */
		/* mean_b = mean - 0.2 std */
		for (l = 0; l < veclen[j]; l++) {
		    /* Use the stddev of mean[l] itself for full covariances. */
		    if (fullvar)
			std = (float32)sqrt(fullvar[i][j][max_wt_idx][l][l]);
		    else
			std = (float32)sqrt(var[i][j][max_wt_idx][l]);
		    
		    new_mean[i][j][max_wt_idx][l] = mean[i][j][max_wt_idx][l] + 0.2f * std;
		    new_mean[i][j][n_density+r][l]  = mean[i][j][max_wt_idx][l] - 0.2f * std;
		}

		did[j][r] = max_wt_idx;
		printf("%u(%.2e)", did[j][r], max_wt);
		fflush(stdout);
	    }
	}
	printf("\n");
    }
	    

    return S3_SUCCESS;
}